

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise.cpp
# Opt level: O2

int __thiscall
ncnn::Eltwise::forward
          (Eltwise *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  Mat *m;
  Mat *this_00;
  pointer pMVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  int i;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int q;
  int iVar10;
  int q_1;
  int iVar11;
  float fVar12;
  Mat local_a0;
  pointer local_58;
  Eltwise *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  iVar11 = m->c;
  uVar9 = m->h * m->w;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create_like(this_00,m,opt->blob_allocator);
  iVar10 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    iVar10 = this->op_type;
    if (iVar10 == 2) {
      pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = 0;
      uVar7 = (ulong)uVar9;
      if ((int)uVar9 < 1) {
        uVar7 = uVar6;
      }
      if (iVar11 < 1) {
        iVar11 = 0;
      }
      while (iVar10 = (int)uVar6, iVar10 != iVar11) {
        Mat::channel(&local_a0,m,iVar10);
        pvVar3 = local_a0.data;
        Mat::~Mat(&local_a0);
        Mat::channel(&local_a0,pMVar2 + 1,iVar10);
        pvVar4 = local_a0.data;
        Mat::~Mat(&local_a0);
        Mat::channel(&local_a0,this_00,iVar10);
        pvVar5 = local_a0.data;
        Mat::~Mat(&local_a0);
        for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
          fVar12 = *(float *)((long)pvVar4 + uVar6 * 4);
          fVar1 = *(float *)((long)pvVar3 + uVar6 * 4);
          if (fVar12 <= fVar1) {
            fVar12 = fVar1;
          }
          *(float *)((long)pvVar5 + uVar6 * 4) = fVar12;
        }
        uVar6 = (ulong)(iVar10 + 1);
      }
      for (uVar6 = 2;
          pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start,
          uVar6 < (ulong)(((long)(bottom_blobs->
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pMVar2) / 0x48);
          uVar6 = uVar6 + 1) {
        for (iVar10 = 0; iVar10 != iVar11; iVar10 = iVar10 + 1) {
          Mat::channel(&local_a0,pMVar2 + uVar6,iVar10);
          pvVar3 = local_a0.data;
          Mat::~Mat(&local_a0);
          Mat::channel(&local_a0,this_00,iVar10);
          pvVar4 = local_a0.data;
          Mat::~Mat(&local_a0);
          for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
            fVar12 = *(float *)((long)pvVar3 + uVar8 * 4);
            fVar1 = *(float *)((long)pvVar4 + uVar8 * 4);
            if (fVar12 <= fVar1) {
              fVar12 = fVar1;
            }
            *(float *)((long)pvVar4 + uVar8 * 4) = fVar12;
          }
        }
      }
    }
    else if (iVar10 == 1) {
      local_58 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start + 1;
      if ((this->coeffs).w == 0) {
        uVar6 = 0;
        uVar7 = (ulong)uVar9;
        if ((int)uVar9 < 1) {
          uVar7 = uVar6;
        }
        if (iVar11 < 1) {
          iVar11 = 0;
        }
        while (iVar10 = (int)uVar6, iVar10 != iVar11) {
          Mat::channel(&local_a0,m,iVar10);
          pvVar3 = local_a0.data;
          Mat::~Mat(&local_a0);
          Mat::channel(&local_a0,local_58,iVar10);
          pvVar4 = local_a0.data;
          Mat::~Mat(&local_a0);
          Mat::channel(&local_a0,this_00,iVar10);
          pvVar5 = local_a0.data;
          Mat::~Mat(&local_a0);
          for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
            *(float *)((long)pvVar5 + uVar6 * 4) =
                 *(float *)((long)pvVar4 + uVar6 * 4) + *(float *)((long)pvVar3 + uVar6 * 4);
          }
          uVar6 = (ulong)(iVar10 + 1);
        }
        for (uVar6 = 2;
            pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start,
            uVar6 < (ulong)(((long)(bottom_blobs->
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2) / 0x48)
            ; uVar6 = uVar6 + 1) {
          for (iVar10 = 0; iVar10 != iVar11; iVar10 = iVar10 + 1) {
            Mat::channel(&local_a0,pMVar2 + uVar6,iVar10);
            pvVar3 = local_a0.data;
            Mat::~Mat(&local_a0);
            Mat::channel(&local_a0,this_00,iVar10);
            pvVar4 = local_a0.data;
            Mat::~Mat(&local_a0);
            for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
              *(float *)((long)pvVar4 + uVar8 * 4) =
                   *(float *)((long)pvVar4 + uVar8 * 4) + *(float *)((long)pvVar3 + uVar8 * 4);
            }
          }
        }
      }
      else {
        local_48 = *(this->coeffs).data;
        if ((int)uVar9 < 1) {
          uVar9 = 0;
        }
        if (iVar11 < 1) {
          iVar11 = 0;
        }
        uStack_40 = 0;
        local_50 = this;
        for (iVar10 = 0; iVar10 != iVar11; iVar10 = iVar10 + 1) {
          Mat::channel(&local_a0,m,iVar10);
          pvVar3 = local_a0.data;
          Mat::~Mat(&local_a0);
          Mat::channel(&local_a0,local_58,iVar10);
          pvVar4 = local_a0.data;
          Mat::~Mat(&local_a0);
          Mat::channel(&local_a0,this_00,iVar10);
          pvVar5 = local_a0.data;
          Mat::~Mat(&local_a0);
          for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
            *(float *)((long)pvVar5 + uVar7 * 4) =
                 *(float *)((long)pvVar4 + uVar7 * 4) * local_48._4_4_ +
                 *(float *)((long)pvVar3 + uVar7 * 4) * (float)local_48;
          }
        }
        for (uVar7 = 2;
            pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start,
            uVar7 < (ulong)(((long)(bottom_blobs->
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)pMVar2) / 0x48)
            ; uVar7 = uVar7 + 1) {
          fVar12 = *(float *)((long)(local_50->coeffs).data + uVar7 * 4);
          for (iVar10 = 0; iVar10 != iVar11; iVar10 = iVar10 + 1) {
            Mat::channel(&local_a0,pMVar2 + uVar7,iVar10);
            pvVar3 = local_a0.data;
            Mat::~Mat(&local_a0);
            Mat::channel(&local_a0,this_00,iVar10);
            pvVar4 = local_a0.data;
            Mat::~Mat(&local_a0);
            for (uVar6 = 0; uVar9 != uVar6; uVar6 = uVar6 + 1) {
              *(float *)((long)pvVar4 + uVar6 * 4) =
                   *(float *)((long)pvVar3 + uVar6 * 4) * fVar12 +
                   *(float *)((long)pvVar4 + uVar6 * 4);
            }
          }
        }
      }
    }
    else {
      if (iVar10 != 0) {
        return 0;
      }
      pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = 0;
      uVar7 = (ulong)uVar9;
      if ((int)uVar9 < 1) {
        uVar7 = uVar6;
      }
      if (iVar11 < 1) {
        iVar11 = 0;
      }
      while (iVar10 = (int)uVar6, iVar10 != iVar11) {
        Mat::channel(&local_a0,m,iVar10);
        pvVar3 = local_a0.data;
        Mat::~Mat(&local_a0);
        Mat::channel(&local_a0,pMVar2 + 1,iVar10);
        pvVar4 = local_a0.data;
        Mat::~Mat(&local_a0);
        Mat::channel(&local_a0,this_00,iVar10);
        pvVar5 = local_a0.data;
        Mat::~Mat(&local_a0);
        for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
          *(float *)((long)pvVar5 + uVar6 * 4) =
               *(float *)((long)pvVar4 + uVar6 * 4) * *(float *)((long)pvVar3 + uVar6 * 4);
        }
        uVar6 = (ulong)(iVar10 + 1);
      }
      for (uVar6 = 2;
          pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start,
          uVar6 < (ulong)(((long)(bottom_blobs->
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                                 super__Vector_impl_data._M_finish - (long)pMVar2) / 0x48);
          uVar6 = uVar6 + 1) {
        for (iVar10 = 0; iVar10 != iVar11; iVar10 = iVar10 + 1) {
          Mat::channel(&local_a0,pMVar2 + uVar6,iVar10);
          pvVar3 = local_a0.data;
          Mat::~Mat(&local_a0);
          Mat::channel(&local_a0,this_00,iVar10);
          pvVar4 = local_a0.data;
          Mat::~Mat(&local_a0);
          for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
            *(float *)((long)pvVar4 + uVar8 * 4) =
                 *(float *)((long)pvVar4 + uVar8 * 4) * *(float *)((long)pvVar3 + uVar8 * 4);
          }
        }
      }
    }
    iVar10 = 0;
  }
  return iVar10;
}

Assistant:

int Eltwise::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int size = w * h;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = ptr[i] * ptr1[i];
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob1 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] *= ptr[i];
                }
            }
        }
    }
    else if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = ptr[i] + ptr1[i];
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob1 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] += ptr[i];
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            float coeff0 = coeffs[0];
            float coeff1 = coeffs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = ptr[i] * coeff0 + ptr1[i] * coeff1;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob1 = bottom_blobs[b];
                float coeff = coeffs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        outptr[i] += ptr[i] * coeff;
                    }
                }
            }
        }
    }
    else if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = std::max(ptr[i], ptr1[i]);
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob1 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    outptr[i] = std::max(outptr[i], ptr[i]);
                }
            }
        }
    }

    return 0;
}